

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::copyTexSubImage2D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int yoffset,int x,int y,
          int width,int height)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  int iVar4;
  PixelBufferAccess *pPVar5;
  ConstPixelBufferAccess *pCVar6;
  TextureCube *local_140;
  void *local_128;
  Vec4 local_118;
  int local_108;
  int local_104;
  int xo_1;
  int yo_1;
  PixelBufferAccess dst_1;
  CubeFace face;
  TextureCube *texture_1;
  int local_b8;
  int local_b4;
  int xo;
  int yo;
  PixelBufferAccess dst;
  Texture2D *texture;
  undefined1 local_58 [8];
  MultisampleConstPixelBufferAccess src;
  TextureUnit *unit;
  int x_local;
  int yoffset_local;
  int xoffset_local;
  int level_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  src.m_access.m_data =
       std::
       vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
       ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  getReadColorbuffer((MultisamplePixelBufferAccess *)&texture,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_58,(MultisamplePixelBufferAccess *)&texture)
  ;
  do {
    if ((xoffset < 0) || (yoffset < 0)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    if ((width < 0) || (height < 0)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    bVar1 = isEmpty((MultisampleConstPixelBufferAccess *)local_58);
    if (bVar1) {
      setError(this,0x502);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (target == 0xde1) {
    if (*(long *)((long)src.m_access.m_data + 8) == 0) {
      local_128 = (void *)((long)src.m_access.m_data + 0x5e0);
    }
    else {
      local_128 = *(void **)((long)src.m_access.m_data + 8);
    }
    dst.super_ConstPixelBufferAccess.m_data = local_128;
    do {
      bVar1 = rc::Texture2D::hasLevel((Texture2D *)dst.super_ConstPixelBufferAccess.m_data,level);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar5 = rc::Texture2D::getLevel((Texture2D *)dst.super_ConstPixelBufferAccess.m_data,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&xo,pPVar5);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&xo);
      if ((iVar3 < xoffset + width) ||
         (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&xo),
         iVar3 < yoffset + height)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    for (local_b4 = 0; local_b4 < height; local_b4 = local_b4 + 1) {
      for (local_b8 = 0; local_b8 < width; local_b8 = local_b8 + 1) {
        iVar3 = x + local_b8;
        pCVar6 = rr::MultisampleConstPixelBufferAccess::raw
                           ((MultisampleConstPixelBufferAccess *)local_58);
        iVar4 = tcu::ConstPixelBufferAccess::getHeight(pCVar6);
        bVar1 = de::inBounds<int>(iVar3,0,iVar4);
        if (bVar1) {
          iVar3 = y + local_b4;
          pCVar6 = rr::MultisampleConstPixelBufferAccess::raw
                             ((MultisampleConstPixelBufferAccess *)local_58);
          iVar4 = tcu::ConstPixelBufferAccess::getDepth(pCVar6);
          bVar1 = de::inBounds<int>(iVar3,0,iVar4);
          if (bVar1) {
            rr::resolveMultisamplePixel
                      ((rr *)&texture_1,(MultisampleConstPixelBufferAccess *)local_58,x + local_b8,
                       y + local_b4);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&xo,(Vec4 *)&texture_1,local_b8 + xoffset,
                       local_b4 + yoffset,0);
          }
        }
      }
    }
  }
  else if (((((target == 0x8516) || (target == 0x8515)) || (target == 0x8518)) ||
           ((target == 0x8517 || (target == 0x851a)))) || (target == 0x8519)) {
    if (*(long *)((long)src.m_access.m_data + 0x10) == 0) {
      local_140 = (TextureCube *)((long)src.m_access.m_data + 0xb90);
    }
    else {
      local_140 = *(TextureCube **)((long)src.m_access.m_data + 0x10);
    }
    dst_1.super_ConstPixelBufferAccess.m_data._4_4_ = mapGLCubeFace(target);
    do {
      bVar1 = rc::TextureCube::hasFace
                        (local_140,level,dst_1.super_ConstPixelBufferAccess.m_data._4_4_);
      if (!bVar1) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pPVar5 = rc::TextureCube::getFace
                       (local_140,level,dst_1.super_ConstPixelBufferAccess.m_data._4_4_);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&xo_1,pPVar5);
    do {
      iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&xo_1);
      if ((iVar3 < xoffset + width) ||
         (iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&xo_1),
         iVar3 < yoffset + height)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    for (local_104 = 0; local_104 < height; local_104 = local_104 + 1) {
      for (local_108 = 0; local_108 < width; local_108 = local_108 + 1) {
        iVar3 = x + local_108;
        pCVar6 = rr::MultisampleConstPixelBufferAccess::raw
                           ((MultisampleConstPixelBufferAccess *)local_58);
        iVar4 = tcu::ConstPixelBufferAccess::getHeight(pCVar6);
        bVar1 = de::inBounds<int>(iVar3,0,iVar4);
        if (bVar1) {
          iVar3 = y + local_104;
          pCVar6 = rr::MultisampleConstPixelBufferAccess::raw
                             ((MultisampleConstPixelBufferAccess *)local_58);
          iVar4 = tcu::ConstPixelBufferAccess::getDepth(pCVar6);
          bVar1 = de::inBounds<int>(iVar3,0,iVar4);
          if (bVar1) {
            rr::resolveMultisamplePixel
                      ((rr *)&local_118,(MultisampleConstPixelBufferAccess *)local_58,x + local_108,
                       y + local_104);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&xo_1,&local_118,local_108 + xoffset,local_104 + yoffset
                       ,0);
          }
        }
      }
    }
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::copyTexSubImage2D (deUint32 target, int level, int xoffset, int yoffset, int x, int y, int width, int height)
{
	TextureUnit&							unit	= m_textureUnits[m_activeTexture];
	rr::MultisampleConstPixelBufferAccess	src		= getReadColorbuffer();

	RC_IF_ERROR(xoffset < 0 || yoffset < 0,					GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0,					GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src),								GL_INVALID_OPERATION, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth() ||
					yoffset + height	> dst.getHeight(),
					GL_INVALID_VALUE, RC_RET_VOID);

		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo+xoffset, yo+yoffset);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		TextureCube&	texture		= unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;
		tcu::CubeFace	face		= mapGLCubeFace(target);

		RC_IF_ERROR(!texture.hasFace(level, face), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getFace(level, face);

		RC_IF_ERROR(xoffset + width		> dst.getWidth() ||
					yoffset + height	> dst.getHeight(),
					GL_INVALID_VALUE, RC_RET_VOID);

		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo+xoffset, yo+yoffset);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}